

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.cpp
# Opt level: O3

decNumber * uprv_decNumberInvert_63(decNumber *res,decNumber *rhs,decContext *set)

{
  uint8_t *puVar1;
  byte bVar2;
  int iVar3;
  uint8_t *puVar4;
  int iVar5;
  uint8_t *puVar6;
  ulong uVar7;
  uint8_t *puVar8;
  ulong uVar9;
  
  if ((rhs->exponent != 0) || (0xf < rhs->bits)) {
LAB_0023fc49:
    res->digits = 1;
    res->exponent = 0;
    res->bits = ' ';
    res->lsu[0] = '\0';
    uprv_decContextSetStatus_63(set,0x80);
    return res;
  }
  uVar7 = (ulong)rhs->digits;
  if ((long)uVar7 < 0x32) {
    uVar7 = (ulong)""[uVar7];
  }
  puVar1 = res->lsu;
  uVar9 = (ulong)set->digits;
  puVar4 = puVar1;
  if ((long)uVar9 < 0x32) {
    if (set->digits == 0) goto LAB_0023fc0d;
    uVar9 = (ulong)""[uVar9];
  }
  puVar6 = rhs->lsu;
  puVar8 = puVar6 + ((uVar7 & 0xffffffff) - 1);
  do {
    if (puVar8 < puVar6) {
      *puVar4 = '\x01';
    }
    else {
      bVar2 = *puVar6;
      *puVar4 = ~bVar2 & 1;
      if (1 < (byte)(bVar2 + (bVar2 / 5 & 0xfe) * -5)) goto LAB_0023fc49;
    }
    puVar6 = puVar6 + 1;
    puVar4 = puVar4 + 1;
  } while (puVar4 <= res->lsu + (uVar9 - 1));
LAB_0023fc0d:
  iVar5 = (int)puVar4 - (int)puVar1;
  puVar6 = puVar1 + (long)iVar5 + -1;
  if (puVar1 <= puVar6) {
    iVar3 = ((int)puVar4 - (int)res) + -10;
    do {
      iVar5 = iVar3;
      if ((*puVar6 != '\0') || (iVar5 == 0)) {
        iVar5 = iVar5 + 1;
        break;
      }
      puVar6 = puVar6 + -1;
      iVar3 = iVar5 + -1;
    } while (puVar1 <= puVar6);
  }
  res->digits = iVar5;
  res->exponent = 0;
  res->bits = '\0';
  return res;
}

Assistant:

U_CAPI decNumber * U_EXPORT2 uprv_decNumberInvert(decNumber *res, const decNumber *rhs,
                            decContext *set) {
  const Unit *ua, *msua;                /* -> operand and its msu  */
  Unit  *uc, *msuc;                     /* -> result and its msu  */
  Int   msudigs;                        /* digits in res msu  */
  #if DECCHECK
  if (decCheckOperands(res, DECUNUSED, rhs, set)) return res;
  #endif

  if (rhs->exponent!=0 || decNumberIsSpecial(rhs) || decNumberIsNegative(rhs)) {
    decStatus(res, DEC_Invalid_operation, set);
    return res;
    }
  /* operand is valid  */
  ua=rhs->lsu;                          /* bottom-up  */
  uc=res->lsu;                          /* ..  */
  msua=ua+D2U(rhs->digits)-1;           /* -> msu of rhs  */
  msuc=uc+D2U(set->digits)-1;           /* -> msu of result  */
  msudigs=MSUDIGITS(set->digits);       /* [faster than remainder]  */
  for (; uc<=msuc; ua++, uc++) {        /* Unit loop  */
    Unit a;                             /* extract unit  */
    Int  i, j;                          /* work  */
    if (ua>msua) a=0;
     else a=*ua;
    *uc=0;                              /* can now write back  */
    /* always need to examine all bits in rhs  */
    /* This loop could be unrolled and/or use BIN2BCD tables  */
    for (i=0; i<DECDPUN; i++) {
      if ((~a)&1) *uc=*uc+(Unit)powers[i];   /* effect INVERT  */
      j=a%10;
      a=a/10;
      if (j>1) {
        decStatus(res, DEC_Invalid_operation, set);
        return res;
        }
      if (uc==msuc && i==msudigs-1) break;   /* just did final digit  */
      } /* each digit  */
    } /* each unit  */
  /* [here uc-1 is the msu of the result]  */
  res->digits=decGetDigits(res->lsu, static_cast<int32_t>(uc - res->lsu));
  res->exponent=0;                      /* integer  */
  res->bits=0;                          /* sign=0  */
  return res;  /* [no status to set]  */
  }